

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::ExpressionsDynamicIndexing1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsDynamicIndexing1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  long *plVar1;
  ulong *puVar2;
  undefined1 *puVar3;
  long lVar4;
  TestError *pTVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  string *psVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long lVar12;
  string expression_type_declarations;
  string shader_source;
  string expressions [4];
  
  expression_type_declarations._M_dataplus._M_p = (pointer)&expression_type_declarations.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&expression_type_declarations,
             "uniform int a;\nconst int b = 0;\nint c = 0;\nfloat x[2][2];\n","");
  expressions[0]._M_dataplus._M_p = (pointer)&expressions[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)expressions,"a","");
  expressions[1]._M_dataplus._M_p = (pointer)&expressions[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(expressions + 1),"b","");
  expressions[2]._M_dataplus._M_p = (pointer)&expressions[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(expressions + 2),"c","");
  paVar11 = &expressions[3].field_2;
  expressions[3]._M_dataplus._M_p = (pointer)paVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)(expressions + 3),"0 + 1","");
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  shader_source._M_string_length = 0;
  shader_source.field_2._M_local_buf[0] = '\0';
  lVar4 = 0;
  do {
    lVar12 = 8;
    do {
      std::__cxx11::string::_M_assign((string *)&shader_source);
      std::__cxx11::string::_M_append((char *)&shader_source,shader_start_abi_cxx11_);
      std::__cxx11::string::append((char *)&shader_source);
      std::__cxx11::string::_M_append
                ((char *)&shader_source,(ulong)expressions[lVar4]._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&shader_source);
      std::__cxx11::string::_M_append
                ((char *)&shader_source,*(ulong *)((long)expressions + lVar12 + -8));
      std::__cxx11::string::append((char *)&shader_source);
      puVar2 = &set_tesseation_abi_cxx11_;
      switch(tested_shader_type) {
      case FRAGMENT_SHADER_TYPE:
      case COMPUTE_SHADER_TYPE:
      case TESSELATION_EVALUATION_SHADER_TYPE:
        break;
      case VERTEX_SHADER_TYPE:
        std::__cxx11::string::append((char *)&shader_source);
        break;
      case GEOMETRY_SHADER_TYPE:
        puVar2 = &emit_quad_abi_cxx11_;
      case TESSELATION_CONTROL_SHADER_TYPE:
        std::__cxx11::string::_M_append((char *)&shader_source,*puVar2);
        break;
      default:
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0xd1b);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
      puVar8 = empty_string_abi_cxx11_;
      puVar7 = empty_string_abi_cxx11_;
      puVar6 = empty_string_abi_cxx11_;
      puVar9 = empty_string_abi_cxx11_;
      puVar3 = (undefined1 *)&shader_source;
      psVar10 = (string *)empty_string_abi_cxx11_;
      switch(tested_shader_type) {
      case FRAGMENT_SHADER_TYPE:
        puVar3 = empty_string_abi_cxx11_;
        puVar8 = default_vertex_shader_source_abi_cxx11_;
        puVar7 = default_tc_shader_source_abi_cxx11_;
        puVar6 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
        puVar9 = default_geometry_shader_source_abi_cxx11_;
        psVar10 = &shader_source;
        break;
      case VERTEX_SHADER_TYPE:
        puVar7 = default_tc_shader_source_abi_cxx11_;
        puVar8 = (undefined1 *)&shader_source;
        goto LAB_00b6a838;
      case COMPUTE_SHADER_TYPE:
        break;
      case GEOMETRY_SHADER_TYPE:
        puVar8 = default_vertex_shader_source_abi_cxx11_;
        puVar7 = default_tc_shader_source_abi_cxx11_;
        puVar6 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
        puVar9 = (undefined1 *)&shader_source;
        goto LAB_00b6a879;
      case TESSELATION_CONTROL_SHADER_TYPE:
        puVar7 = (undefined1 *)&shader_source;
        puVar8 = default_vertex_shader_source_abi_cxx11_;
LAB_00b6a838:
        puVar6 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
LAB_00b6a872:
        puVar9 = default_geometry_shader_source_abi_cxx11_;
LAB_00b6a879:
        puVar3 = empty_string_abi_cxx11_;
        psVar10 = (string *)default_fragment_shader_source_abi_cxx11_;
        break;
      case TESSELATION_EVALUATION_SHADER_TYPE:
        puVar8 = default_vertex_shader_source_abi_cxx11_;
        puVar7 = default_tc_shader_source_abi_cxx11_;
        puVar6 = (undefined1 *)&shader_source;
        goto LAB_00b6a872;
      default:
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0xd1e);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
        super_TestNode._vptr_TestNode[10])(this,puVar8,puVar7,puVar6,puVar9,psVar10,puVar3,1,0);
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0x88);
    lVar4 = lVar4 + 1;
    if (lVar4 == 4) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
        operator_delete(shader_source._M_dataplus._M_p,
                        CONCAT71(shader_source.field_2._M_allocated_capacity._1_7_,
                                 shader_source.field_2._M_local_buf[0]) + 1);
      }
      lVar4 = -0x80;
      do {
        plVar1 = (long *)(((string *)(paVar11 + -1))->_M_dataplus)._M_p;
        if (paVar11 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar1) {
          operator_delete(plVar1,paVar11->_M_allocated_capacity + 1);
        }
        paVar11 = paVar11 + -2;
        lVar4 = lVar4 + 0x20;
      } while (lVar4 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)expression_type_declarations._M_dataplus._M_p != &expression_type_declarations.field_2)
      {
        operator_delete(expression_type_declarations._M_dataplus._M_p,
                        expression_type_declarations.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void ExpressionsDynamicIndexing1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string expression_type_declarations = "uniform int a;\n"
											   "const int b = 0;\n"
											   "int c = 0;\n"
											   "float x[2][2];\n";

	std::string expressions[] = { "a", "b", "c", "0 + 1" };
	std::string shader_source;

	for (size_t write_index = 0; write_index < sizeof(expressions) / sizeof(expressions[0]); write_index++)
	{
		for (size_t read_index = 0; read_index < sizeof(expressions) / sizeof(expressions[0]); read_index++)
		{
			shader_source = expression_type_declarations;
			shader_source += shader_start;
			shader_source += "    x[";
			shader_source += expressions[write_index];
			shader_source += "][";
			shader_source += expressions[read_index];
			shader_source += "] = 1.0;\n\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
		} /* for (int read_index = 0; ...) */
	}	 /* for (int write_index = 0; ...) */
}